

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall lexer_exception::~lexer_exception(lexer_exception *this)

{
  *(undefined ***)this = &PTR__lexer_exception_001599c8;
  std::__cxx11::string::~string((string *)&this->msg_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~lexer_exception() throw() { }